

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O0

void metrics_routine_cb(void *arg)

{
  int iVar1;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint64_t uStack_3c8;
  int cntr;
  uint64_t idle_time;
  uv_timer_t timer;
  uv_loop_t loop;
  uint64_t timeout;
  void *arg_local;
  
  eval_a._4_4_ = 0;
  idle_time = (long)&eval_a + 4;
  iVar1 = uv_loop_init((uv_loop_t *)&timer.start_id);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x5a,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_loop_configure((uv_loop_t *)&timer.start_id,UV_METRICS_IDLE_TIME);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x5b,"uv_loop_configure(&loop, UV_METRICS_IDLE_TIME)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_init((uv_loop_t *)&timer.start_id,(uv_timer_t *)&idle_time);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x5c,"uv_timer_init(&loop, &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)&idle_time,timer_spin_cb,1000,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x5d,"uv_timer_start(&timer, timer_spin_cb, timeout, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run((uv_loop_t *)&timer.start_id,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x5f,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)eval_a._4_4_ < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x60,"cntr",">","0",(long)eval_a._4_4_,">",0);
    abort();
  }
  uStack_3c8 = uv_metrics_idle_time((uv_loop_t *)&timer.start_id);
  if ((long)uStack_3c8 < 500000000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x68,"idle_time",">=","(timeout - 500) * 1000000",uStack_3c8,">=",500000000);
    abort();
  }
  close_loop((uv_loop_t *)&timer.start_id);
  iVar1 = uv_loop_close((uv_loop_t *)&timer.start_id);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x6b,"uv_loop_close(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void metrics_routine_cb(void* arg) {
  const uint64_t timeout = 1000;
  uv_loop_t loop;
  uv_timer_t timer;
  uint64_t idle_time;
  int cntr;

  cntr = 0;
  timer.data = &cntr;

  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_loop_configure(&loop, UV_METRICS_IDLE_TIME));
  ASSERT_OK(uv_timer_init(&loop, &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_spin_cb, timeout, 0));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_GT(cntr, 0);

  idle_time = uv_metrics_idle_time(&loop);

  /* Only checking that idle time is greater than the lower bound since there
   * may have been thread contention, causing the event loop to be delayed in
   * the idle phase longer than expected.
   */
  ASSERT_GE(idle_time, (timeout - 500) * UV_NS_TO_MS);

  close_loop(&loop);
  ASSERT_OK(uv_loop_close(&loop));
}